

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void InitDefaultsscc_info_DescriptorProto_ExtensionRange_google_2fprotobuf_2fdescriptor_2eproto
               (void)

{
  google::protobuf::internal::VerifyVersion
            (0x2df5a4,0x2df5a0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/descriptor.pb.cc"
            );
  _DAT_003d3038 = 0;
  uRam00000000003d3040 = 0;
  google::protobuf::_DescriptorProto_ExtensionRange_default_instance_ =
       &PTR__DescriptorProto_ExtensionRange_003c52a8;
  if (scc_info_DescriptorProto_ExtensionRange_google_2fprotobuf_2fdescriptor_2eproto.base.
      visit_status.super___atomic_base<int>._M_i != 0) {
    google::protobuf::internal::InitSCCImpl
              (&scc_info_DescriptorProto_ExtensionRange_google_2fprotobuf_2fdescriptor_2eproto.base)
    ;
  }
  DAT_003d3048 = (undefined1 *)0x0;
  uRam00000000003d3050 = 0;
  google::protobuf::internal::OnShutdownRun
            (google::protobuf::internal::DestroyMessage,
             &google::protobuf::_DescriptorProto_ExtensionRange_default_instance_);
  DAT_003d3048 = google::protobuf::_ExtensionRangeOptions_default_instance_;
  return;
}

Assistant:

static void InitDefaultsscc_info_DescriptorProto_ExtensionRange_google_2fprotobuf_2fdescriptor_2eproto() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  {
    void* ptr = &PROTOBUF_NAMESPACE_ID::_DescriptorProto_ExtensionRange_default_instance_;
    new (ptr) PROTOBUF_NAMESPACE_ID::DescriptorProto_ExtensionRange();
    ::PROTOBUF_NAMESPACE_ID::internal::OnShutdownDestroyMessage(ptr);
  }
  PROTOBUF_NAMESPACE_ID::DescriptorProto_ExtensionRange::InitAsDefaultInstance();
}